

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O3

void __thiscall http::Page::ParseArg(Page *this,char *arg,char **name,char **value)

{
  char *pcVar1;
  
  *name = arg;
  do {
    pcVar1 = arg;
    if (*pcVar1 == '\0') {
      return;
    }
    arg = pcVar1 + 1;
  } while (*pcVar1 != '=');
  *pcVar1 = '\0';
  *value = pcVar1 + 1;
  return;
}

Assistant:

void http::Page::ParseArg(char* arg, char** name, char** value)
{
    *name = arg;
    while (*arg)
    {
        if (*arg == '=')
        {
            *arg = 0;
            *value = ++arg;
            break;
        }
        arg++;
    }
}